

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O0

void __thiscall
gui::RadioButton::RadioButton
          (RadioButton *this,shared_ptr<gui::RadioButtonStyle> *style,String *name)

{
  String *in_RSI;
  shared_ptr<gui::ButtonStyle> *in_RDI;
  Button *unaff_retaddr;
  shared_ptr<gui::RadioButtonStyle> *in_stack_ffffffffffffffa8;
  String *name_00;
  shared_ptr<gui::ButtonStyle> *style_00;
  
  name_00 = in_RSI;
  style_00 = in_RDI;
  std::shared_ptr<gui::ButtonStyle>::shared_ptr
            ((shared_ptr<gui::ButtonStyle> *)in_RSI,in_stack_ffffffffffffffa8);
  Button::Button(unaff_retaddr,style_00,name_00);
  std::shared_ptr<gui::ButtonStyle>::~shared_ptr((shared_ptr<gui::ButtonStyle> *)0x1d4fc5);
  (in_RDI->super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__RadioButton_002f7e18;
  std::shared_ptr<gui::RadioButtonStyle>::shared_ptr
            ((shared_ptr<gui::RadioButtonStyle> *)in_RSI,in_stack_ffffffffffffffa8);
  *(undefined1 *)
   &in_RDI[0x2e].super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  *(undefined1 *)
   ((long)&in_RDI[0x2e].super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1)
       = 0;
  return;
}

Assistant:

RadioButton::RadioButton(std::shared_ptr<RadioButtonStyle> style, const sf::String& name) :
    baseClass(nullptr, name),
    style_(style),
    styleCopied_(false),
    isChecked_(false) {
}